

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomUI::write(DomUI *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  short sVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QAnyStringView QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QAnyStringView QVar28;
  QAnyStringView QVar29;
  QAnyStringView QVar30;
  QAnyStringView QVar31;
  QAnyStringView QVar32;
  QAnyStringView QVar33;
  QAnyStringView QVar34;
  QAnyStringView QVar35;
  QString local_48;
  long local_30;
  
  aVar4._4_4_ = in_register_00000034;
  aVar4._0_4_ = __fd;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"ui";
    local_48.d.size = 2;
  }
  else {
    QString::toLower_helper(&local_48);
  }
  QVar5.m_size = (size_t)local_48.d.ptr;
  QVar5.field_0.m_data = aVar4.m_data;
  QXmlStreamWriter::writeStartElement(QVar5);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_version == true) {
    pQVar1 = &((this->m_attr_version).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_version).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar7.m_size = (size_t)L"version";
      QVar7.field_0.m_data = aVar4.m_data;
      QVar22.m_size = __n;
      QVar22.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
      QXmlStreamWriter::writeAttribute(QVar7,QVar22);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar6.m_size = (size_t)L"version";
      QVar6.field_0.m_data = aVar4.m_data;
      QVar21.m_size = __n;
      QVar21.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
      QXmlStreamWriter::writeAttribute(QVar6,QVar21);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_language == true) {
    pQVar1 = &((this->m_attr_language).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_language).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar9.m_size = (size_t)L"language";
      QVar9.field_0.m_data = aVar4.m_data;
      QVar24.m_size = __n;
      QVar24.field_0.m_data = (void *)0x8000000000000008;
      QXmlStreamWriter::writeAttribute(QVar9,QVar24);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar8.m_size = (size_t)L"language";
      QVar8.field_0.m_data = aVar4.m_data;
      QVar23.m_size = __n;
      QVar23.field_0.m_data = (void *)0x8000000000000008;
      QXmlStreamWriter::writeAttribute(QVar8,QVar23);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_displayname == true) {
    pQVar1 = &((this->m_attr_displayname).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_displayname).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar11.m_size = (size_t)L"displayname";
      QVar11.field_0.m_data = aVar4.m_data;
      QVar26.m_size = __n;
      QVar26.field_0.m_data = (void *)0x800000000000000b;
      QXmlStreamWriter::writeAttribute(QVar11,QVar26);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar10.m_size = (size_t)L"displayname";
      QVar10.field_0.m_data = aVar4.m_data;
      QVar25.m_size = __n;
      QVar25.field_0.m_data = (void *)0x800000000000000b;
      QXmlStreamWriter::writeAttribute(QVar10,QVar25);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_idbasedtr == true) {
    __n = (size_t)L"false";
    if (this->m_attr_idbasedtr != false) {
      __n = (size_t)L"true";
    }
    QVar12.m_size = (size_t)L"idbasedtr";
    QVar12.field_0.m_data = aVar4.m_data;
    QVar27.m_size = __n;
    QVar27.field_0.m_data = (void *)0x8000000000000009;
    QXmlStreamWriter::writeAttribute(QVar12,QVar27);
  }
  if (this->m_has_attr_connectslotsbyname == true) {
    __n = (size_t)L"false";
    if (this->m_attr_connectslotsbyname != false) {
      __n = (size_t)L"true";
    }
    QVar13.m_size = (size_t)L"connectslotsbyname";
    QVar13.field_0.m_data = aVar4.m_data;
    QVar28.m_size = __n;
    QVar28.field_0.m_data = (void *)0x8000000000000012;
    QXmlStreamWriter::writeAttribute(QVar13,QVar28);
  }
  if (this->m_has_attr_stdsetdef == true) {
    QString::number((int)&local_48,this->m_attr_stdsetdef);
    QVar14.m_size = (size_t)L"stdsetdef";
    QVar14.field_0.m_data = aVar4.m_data;
    QVar29.m_size = (size_t)local_48.d.ptr;
    QVar29.field_0.m_data = (void *)0x8000000000000009;
    __n = (size_t)local_48.d.ptr;
    QXmlStreamWriter::writeAttribute(QVar14,QVar29);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (this->m_has_attr_stdSetDef == true) {
    QString::number((int)&local_48,this->m_attr_stdSetDef);
    QVar15.m_size = (size_t)L"stdsetdef";
    QVar15.field_0.m_data = aVar4.m_data;
    QVar30.m_size = (size_t)local_48.d.ptr;
    QVar30.field_0.m_data = (void *)0x8000000000000009;
    __n = (size_t)local_48.d.ptr;
    QXmlStreamWriter::writeAttribute(QVar15,QVar30);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  uVar3 = this->m_children;
  if ((uVar3 & 1) != 0) {
    __n = (size_t)(this->m_author).d.ptr;
    QVar16.m_size = (size_t)L"author";
    QVar16.field_0.m_data = aVar4.m_data;
    QVar31.m_size = __n;
    QVar31.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeTextElement(QVar16,QVar31);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 2) != 0) {
    __n = (size_t)(this->m_comment).d.ptr;
    QVar17.m_size = (size_t)L"comment";
    QVar17.field_0.m_data = aVar4.m_data;
    QVar32.m_size = __n;
    QVar32.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
    QXmlStreamWriter::writeTextElement(QVar17,QVar32);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 4) != 0) {
    __n = (size_t)(this->m_exportMacro).d.ptr;
    QVar18.m_size = (size_t)L"exportmacro";
    QVar18.field_0.m_data = aVar4.m_data;
    QVar33.m_size = __n;
    QVar33.field_0.m_data = (void *)0x800000000000000b;
    QXmlStreamWriter::writeTextElement(QVar18,QVar33);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 8) != 0) {
    __n = (size_t)(this->m_class).d.ptr;
    QVar19.m_size = (size_t)L"class";
    QVar19.field_0.m_data = aVar4.m_data;
    QVar34.m_size = __n;
    QVar34.field_0.m_data = (void *)0x8000000000000005;
    QXmlStreamWriter::writeTextElement(QVar19,QVar34);
    uVar3 = this->m_children;
  }
  if ((uVar3 & 0x10) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"widget";
    local_48.d.size = 6;
    DomWidget::write(this->m_widget,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar3 = this->m_children;
  }
  if ((uVar3 & 0x20) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"layoutdefault";
    local_48.d.size = 0xd;
    DomLayoutDefault::write(this->m_layoutDefault,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar3 = this->m_children;
  }
  if ((uVar3 & 0x40) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"layoutfunction";
    local_48.d.size = 0xe;
    DomLayoutFunction::write(this->m_layoutFunction,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar3 = this->m_children;
  }
  if ((char)uVar3 < '\0') {
    __n = (size_t)(this->m_pixmapFunction).d.ptr;
    QVar20.m_size = (size_t)L"pixmapfunction";
    QVar20.field_0.m_data = aVar4.m_data;
    QVar35.m_size = __n;
    QVar35.field_0.m_data = (void *)0x800000000000000e;
    QXmlStreamWriter::writeTextElement(QVar20,QVar35);
    uVar3 = this->m_children;
  }
  if ((uVar3 >> 8 & 1) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"customwidgets";
    local_48.d.size = 0xd;
    DomCustomWidgets::write(this->m_customWidgets,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar3 = this->m_children;
  }
  if ((uVar3 >> 9 & 1) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"tabstops";
    local_48.d.size = 8;
    DomTabStops::write(this->m_tabStops,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar3 = this->m_children;
  }
  if ((uVar3 >> 10 & 1) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"includes";
    local_48.d.size = 8;
    DomIncludes::write(this->m_includes,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar3 = this->m_children;
  }
  if ((uVar3 >> 0xb & 1) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"resources";
    local_48.d.size = 9;
    DomResources::write(this->m_resources,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar3 = this->m_children;
  }
  if ((uVar3 >> 0xc & 1) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"connections";
    local_48.d.size = 0xb;
    DomConnections::write(this->m_connections,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar3 = this->m_children;
  }
  if ((uVar3 >> 0xd & 1) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"designerdata";
    local_48.d.size = 0xc;
    DomDesignerData::write(this->m_designerdata,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar3 = this->m_children;
  }
  sVar2 = (short)uVar3;
  if ((uVar3 >> 0xe & 1) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"slots";
    local_48.d.size = 5;
    DomSlots::write(this->m_slots,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    sVar2 = (short)this->m_children;
  }
  if (sVar2 < 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"buttongroups";
    local_48.d.size = 0xc;
    DomButtonGroups::write(this->m_buttonGroups,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomUI::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("ui") : tagName.toLower());

    if (hasAttributeVersion())
        writer.writeAttribute(u"version"_s, attributeVersion());

    if (hasAttributeLanguage())
        writer.writeAttribute(u"language"_s, attributeLanguage());

    if (hasAttributeDisplayname())
        writer.writeAttribute(u"displayname"_s, attributeDisplayname());

    if (hasAttributeIdbasedtr())
        writer.writeAttribute(u"idbasedtr"_s, (attributeIdbasedtr() ? u"true"_s : u"false"_s));

    if (hasAttributeConnectslotsbyname())
        writer.writeAttribute(u"connectslotsbyname"_s, (attributeConnectslotsbyname() ? u"true"_s : u"false"_s));

    if (hasAttributeStdsetdef())
        writer.writeAttribute(u"stdsetdef"_s, QString::number(attributeStdsetdef()));

    if (hasAttributeStdSetDef())
        writer.writeAttribute(u"stdsetdef"_s, QString::number(attributeStdSetDef()));

    if (m_children & Author)
        writer.writeTextElement(u"author"_s, m_author);

    if (m_children & Comment)
        writer.writeTextElement(u"comment"_s, m_comment);

    if (m_children & ExportMacro)
        writer.writeTextElement(u"exportmacro"_s, m_exportMacro);

    if (m_children & Class)
        writer.writeTextElement(u"class"_s, m_class);

    if (m_children & Widget)
        m_widget->write(writer, u"widget"_s);

    if (m_children & LayoutDefault)
        m_layoutDefault->write(writer, u"layoutdefault"_s);

    if (m_children & LayoutFunction)
        m_layoutFunction->write(writer, u"layoutfunction"_s);

    if (m_children & PixmapFunction)
        writer.writeTextElement(u"pixmapfunction"_s, m_pixmapFunction);

    if (m_children & CustomWidgets)
        m_customWidgets->write(writer, u"customwidgets"_s);

    if (m_children & TabStops)
        m_tabStops->write(writer, u"tabstops"_s);

    if (m_children & Includes)
        m_includes->write(writer, u"includes"_s);

    if (m_children & Resources)
        m_resources->write(writer, u"resources"_s);

    if (m_children & Connections)
        m_connections->write(writer, u"connections"_s);

    if (m_children & Designerdata)
        m_designerdata->write(writer, u"designerdata"_s);

    if (m_children & Slots)
        m_slots->write(writer, u"slots"_s);

    if (m_children & ButtonGroups)
        m_buttonGroups->write(writer, u"buttongroups"_s);

    writer.writeEndElement();
}